

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

bool __thiscall cmCTestHG::StatusParser::ProcessLine(StatusParser *this)

{
  char status;
  bool bVar1;
  char *pcVar2;
  string local_60;
  string local_30;
  StatusParser *local_10;
  StatusParser *this_local;
  
  local_10 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexStatus,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexStatus,1);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_30);
    status = *pcVar2;
    cmsys::RegularExpression::match_abi_cxx11_(&local_60,&this->RegexStatus,2);
    DoPath(this,status,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexStatus.find(this->Line)) {
      this->DoPath(this->RegexStatus.match(1)[0], this->RegexStatus.match(2));
    }
    return true;
  }